

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ExclusiveJoinPromiseNode::get(ExclusiveJoinPromiseNode *this,ExceptionOrValue *output)

{
  PromiseNode *pPVar1;
  Fault f;
  Fault local_8;
  
  pPVar1 = (this->left).dependency.ptr;
  if ((pPVar1 == (PromiseNode *)0x0) &&
     (pPVar1 = (this->right).dependency.ptr, pPVar1 == (PromiseNode *)0x0)) {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              (&local_8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0x396,FAILED,"left.get(output) || right.get(output)",
               "\"get() called before ready.\"",(char (*) [27])"get() called before ready.");
    Debug::Fault::fatal(&local_8);
  }
  (*pPVar1->_vptr_PromiseNode[2])();
  return;
}

Assistant:

void ExclusiveJoinPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(left.get(output) || right.get(output), "get() called before ready.");
}